

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void hexFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  char *z_00;
  char *pcVar3;
  char *pcStack_40;
  uchar c;
  char *z;
  char *zHex;
  uchar *pBlob;
  int n;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  zHex = (char *)sqlite3_value_blob(*argv);
  iVar2 = sqlite3_value_bytes(*argv);
  z_00 = (char *)contextMalloc(context,(long)iVar2 * 2 + 1);
  if (z_00 != (char *)0x0) {
    pcStack_40 = z_00;
    for (pBlob._4_4_ = 0; pBlob._4_4_ < iVar2; pBlob._4_4_ = pBlob._4_4_ + 1) {
      bVar1 = *zHex;
      pcVar3 = pcStack_40 + 1;
      *pcStack_40 = "0123456789ABCDEF"[(int)(uint)bVar1 >> 4];
      pcStack_40 = pcStack_40 + 2;
      *pcVar3 = "0123456789ABCDEF"[(int)(bVar1 & 0xf)];
      zHex = zHex + 1;
    }
    *pcStack_40 = '\0';
    sqlite3_result_text64(context,z_00,(long)pcStack_40 - (long)z_00,sqlite3_free,'\x01');
  }
  return;
}

Assistant:

static void hexFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i, n;
  const unsigned char *pBlob;
  char *zHex, *z;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  pBlob = sqlite3_value_blob(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  assert( pBlob==sqlite3_value_blob(argv[0]) );  /* No encoding change */
  z = zHex = contextMalloc(context, ((i64)n)*2 + 1);
  if( zHex ){
    for(i=0; i<n; i++, pBlob++){
      unsigned char c = *pBlob;
      *(z++) = hexdigits[(c>>4)&0xf];
      *(z++) = hexdigits[c&0xf];
    }
    *z = 0;
    sqlite3_result_text64(context, zHex, (u64)(z-zHex),
                          sqlite3_free, SQLITE_UTF8);
  }
}